

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

void tinyexr::hufCanonicalCodeTable(longlong *hcode)

{
  long lVar1;
  int i_1;
  ulong uVar2;
  int i;
  long lVar3;
  longlong n [59];
  long alStack_1e8 [59];
  
  lVar3 = 0;
  memset(alStack_1e8,0,0x1d8);
  do {
    alStack_1e8[hcode[lVar3]] = alStack_1e8[hcode[lVar3]] + 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10001);
  uVar2 = 0x3b;
  lVar3 = 0;
  do {
    lVar1 = alStack_1e8[uVar2 - 1];
    alStack_1e8[uVar2 - 1] = lVar3;
    uVar2 = uVar2 - 1;
    lVar3 = lVar1 + lVar3 >> 1;
  } while (1 < uVar2);
  lVar3 = 0;
  do {
    if (0 < (int)(uint)hcode[lVar3]) {
      uVar2 = (ulong)((uint)hcode[lVar3] & 0x7fffffff);
      lVar1 = alStack_1e8[uVar2];
      alStack_1e8[uVar2] = lVar1 + 1;
      hcode[lVar3] = lVar1 << 6 | uVar2;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10001);
  return;
}

Assistant:

static void hufCanonicalCodeTable(long long hcode[HUF_ENCSIZE]) {
  long long n[59];

  //
  // For each i from 0 through 58, count the
  // number of different codes of length i, and
  // store the count in n[i].
  //

  for (int i = 0; i <= 58; ++i) n[i] = 0;

  for (int i = 0; i < HUF_ENCSIZE; ++i) n[hcode[i]] += 1;

  //
  // For each i from 58 through 1, compute the
  // numerically lowest code with length i, and
  // store that code in n[i].
  //

  long long c = 0;

  for (int i = 58; i > 0; --i) {
    long long nc = ((c + n[i]) >> 1);
    n[i] = c;
    c = nc;
  }

  //
  // hcode[i] contains the length, l, of the
  // code for symbol i.  Assign the next available
  // code of length l to the symbol and store both
  // l and the code in hcode[i].
  //

  for (int i = 0; i < HUF_ENCSIZE; ++i) {
    int l = static_cast<int>(hcode[i]);

    if (l > 0) hcode[i] = l | (n[l]++ << 6);
  }
}